

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<512,_128>::~ObjectBlockPool(ObjectBlockPool<512,_128> *this)

{
  ObjectBlockPool<512,_128> *this_local;
  
  Reset(this);
  FastVector<SmallBlock<512>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<512>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<512,_128>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}